

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void Load_Trainer(char *filename,bool *save_with_examples)

{
  byte bVar1;
  long *plVar2;
  Am_String *pAVar3;
  Am_Value_List *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Value *pAVar6;
  Am_Object local_2e8;
  Am_String local_2e0;
  Am_Value_List local_2d8 [16];
  Am_Value_List local_2c8 [16];
  Am_Value_List local_2b8 [8];
  Am_Value_List class_list;
  Am_Value_List local_2a8 [8];
  Am_Value_List class_names;
  Am_String local_298;
  Am_String local_290;
  Am_Value_List local_288 [16];
  Am_Value_List local_278 [20];
  undefined4 local_264;
  Am_String local_260;
  Am_String local_258;
  Am_Value_List local_250 [16];
  Am_Value_List local_240 [32];
  long local_220;
  ifstream in;
  bool *save_with_examples_local;
  char *filename_local;
  
  std::ifstream::ifstream(&local_220,filename,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    plVar2 = (long *)operator>>((istream *)&local_220,(Am_Gesture_Trainer *)&trainer);
    bVar1 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if ((bVar1 & 1) == 0) {
      Am_Gesture_Trainer::Get_Class_Names();
      Am_Value_List::Am_Value_List(local_2c8,local_2a8);
      Class_Create_List(local_2b8);
      Am_Value_List::~Am_Value_List(local_2c8);
      pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_2b8);
      Am_Object::Set(0x5510,(Am_Wrapper *)0xa2,(ulong)pAVar5);
      Am_Object::Set(0x5510,0x169,0);
      *save_with_examples = false;
      Am_Value_List::Start();
      while (bVar1 = Am_Value_List::Last(), ((bVar1 ^ 0xff) & 1) != 0) {
        pAVar6 = (Am_Value *)Am_Value_List::Get();
        Am_Object::Am_Object(&local_2e8,pAVar6);
        pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_2e8,(ulong)(ushort)CLASS_NAME);
        Am_String::Am_String(&local_2e0,pAVar6);
        Am_Gesture_Trainer::Get_Examples((Am_String *)local_2d8);
        pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_2d8);
        Am_Value_List::~Am_Value_List(local_2d8);
        Am_String::~Am_String(&local_2e0);
        Am_Object::~Am_Object(&local_2e8);
        if (pAVar5 != (Am_Wrapper *)0x0) {
          *save_with_examples = true;
          break;
        }
        Am_Value_List::Next();
      }
      Am_Object::Set(0x5560,(Am_String *)0x169,0x115570);
      dirty = false;
      Am_Value_List::~Am_Value_List(local_2b8);
      Am_Value_List::~Am_Value_List(local_2a8);
      local_264 = 0;
    }
    else {
      Am_Value_List::Am_Value_List(local_288);
      Am_String::Am_String(&local_290,filename,true);
      pAVar3 = (Am_String *)
               Am_Value_List::Add((Am_String *)local_288,(Am_Add_Position)&local_290,true);
      Am_String::Am_String(&local_298,"is not a gesture classifier.",true);
      pAVar4 = (Am_Value_List *)Am_Value_List::Add(pAVar3,(Am_Add_Position)&local_298,true);
      Am_Value_List::Am_Value_List(local_278,pAVar4);
      Popup_Error(local_278);
      Am_Value_List::~Am_Value_List(local_278);
      Am_String::~Am_String(&local_298);
      Am_String::~Am_String(&local_290);
      Am_Value_List::~Am_Value_List(local_288);
      local_264 = 1;
    }
  }
  else {
    Am_Value_List::Am_Value_List(local_250);
    Am_String::Am_String(&local_258,filename,true);
    pAVar3 = (Am_String *)
             Am_Value_List::Add((Am_String *)local_250,(Am_Add_Position)&local_258,true);
    Am_String::Am_String(&local_260,"can\'t be opened.",true);
    pAVar4 = (Am_Value_List *)Am_Value_List::Add(pAVar3,(Am_Add_Position)&local_260,true);
    Am_Value_List::Am_Value_List(local_240,pAVar4);
    Popup_Error(local_240);
    Am_Value_List::~Am_Value_List(local_240);
    Am_String::~Am_String(&local_260);
    Am_String::~Am_String(&local_258);
    Am_Value_List::~Am_Value_List(local_250);
    local_264 = 1;
  }
  std::ifstream::~ifstream(&local_220);
  return;
}

Assistant:

void
Load_Trainer(char *filename, bool &save_with_examples)
{
  ifstream in(filename);
  if (!in) {
    Popup_Error(Am_Value_List()
                    .Add(Am_String(filename))
                    .Add(Am_String("can't be opened.")));
    return;
  }

  if (!(in >> trainer)) {
    Popup_Error(Am_Value_List()
                    .Add(Am_String(filename))
                    .Add(Am_String("is not a gesture classifier.")));
    return;
  }

  Am_Value_List class_names = trainer.Get_Class_Names();
  Am_Value_List class_list = Class_Create_List(class_names);
  class_panel.Set(Am_ITEMS, class_list);
  class_panel.Set(Am_VALUE, 0);

  save_with_examples = false;
  for (class_list.Start(); !class_list.Last(); class_list.Next())
    if (trainer.Get_Examples(Am_Object(class_list.Get()).Get(CLASS_NAME))) {
      save_with_examples = true;
      break;
    }

  mode.Set(Am_VALUE, training_mode);
  dirty = false;
}